

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::widgets::base_text::load(base_text *this,context *context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int *p_Var2;
  long lVar3;
  char *begin;
  bool bVar4;
  session_interface *this_00;
  request *prVar5;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  const_iterator cVar6;
  form_type *pfVar7;
  form_context *context_00;
  key_type local_50;
  
  p_Var2 = this->_vptr_base_text[-3];
  context_00 = (form_context *)context;
  this_00 = http::context::session(context);
  session_interface::validate_request_origin(this_00);
  base_widget::auto_generate
            ((base_widget *)((long)&this->_vptr_base_text + (long)p_Var2),context_00);
  (this->value_)._M_string_length = 0;
  *(this->value_)._M_dataplus._M_p = '\0';
  this->code_points_ = 0;
  *(uint *)(&this->field_0x1f0 + (long)this->_vptr_base_text[-3]) =
       *(uint *)(&this->field_0x1f0 + (long)this->_vptr_base_text[-3]) | 2;
  *(uint *)(&this->field_0x1f0 + (long)this->_vptr_base_text[-3]) =
       *(uint *)(&this->field_0x1f0 + (long)this->_vptr_base_text[-3]) | 1;
  paVar1 = &local_50.field_2;
  lVar3 = *(long *)((long)&this->low_ + (long)this->_vptr_base_text[-3]);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,lVar3,
             *(long *)(&this->validate_charset_ + (long)this->_vptr_base_text[-3]) + lVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    prVar5 = http::context::request(context);
    this_01 = &http::request::post_or_get_abi_cxx11_(prVar5)->_M_t;
    lVar3 = *(long *)((long)&this->low_ + (long)this->_vptr_base_text[-3]);
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,lVar3,
               *(long *)(&this->validate_charset_ + (long)this->_vptr_base_text[-3]) + lVar3);
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(this_01,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    prVar5 = http::context::request(context);
    pfVar7 = http::request::post_or_get_abi_cxx11_(prVar5);
    if ((_Rb_tree_header *)cVar6._M_node != &(pfVar7->_M_t)._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_assign((string *)&this->value_);
      if (this->validate_charset_ == true) {
        this->code_points_ = 0;
        http::context::locale((context *)&local_50);
        begin = (this->value_)._M_dataplus._M_p;
        bVar4 = encoding::valid((locale *)&local_50,begin,begin + (this->value_)._M_string_length,
                                &this->code_points_);
        std::locale::~locale((locale *)&local_50);
        if (!bVar4) {
          *(uint *)(&this->field_0x1f0 + (long)this->_vptr_base_text[-3]) =
               *(uint *)(&this->field_0x1f0 + (long)this->_vptr_base_text[-3]) & 0xfffffffe;
        }
      }
      else {
        this->code_points_ = (this->value_)._M_string_length;
      }
    }
  }
  return;
}

Assistant:

void base_text::load(http::context &context)
{
	pre_load(context);
	value_.clear();
	code_points_ = 0;
	set(true); // we don't care if the value was set
	valid(true);
	if(name().empty()) {
		return;
	}
	http::request::form_type::const_iterator p;
	p=context.request().post_or_get().find(name());
	if(p==context.request().post_or_get().end()) {
		return;	
	}
	value_=p->second;
	if(validate_charset_) {
		code_points_ = 0;
		if(!encoding::valid(context.locale(),value_.data(),value_.data()+value_.size(),code_points_))
			valid(false);
	}
	else {
		code_points_=value_.size();
	}
}